

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_3D_K.H
# Opt level: O3

void amrex::mlndlap_bc_doit<int>
               (Box *vbx,Array4<int> *a,Box *domain,GpuArray<bool,_3U> *bflo,
               GpuArray<bool,_3U> *bfhi)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  undefined8 uVar15;
  int idim;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int *piVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  int *piVar35;
  char cVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  Long LVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  int iVar48;
  long lVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  Box gdomain;
  int local_130;
  int local_120;
  undefined8 local_98;
  int local_90;
  int local_8c [2];
  undefined8 uStack_84;
  
  uVar15 = *(undefined8 *)((domain->smallend).vect + 2);
  local_8c[1] = (int)((ulong)*(undefined8 *)(domain->bigend).vect >> 0x20);
  uStack_84 = *(undefined8 *)((domain->bigend).vect + 2);
  local_98 = *(undefined8 *)(domain->smallend).vect;
  local_90 = (int)uVar15;
  local_8c[0] = (int)((ulong)uVar15 >> 0x20);
  lVar22 = 0;
  do {
    if (bflo->arr[lVar22] == false) {
      piVar11 = (int *)((long)&local_98 + lVar22 * 4);
      *piVar11 = *piVar11 + -1;
    }
    if (bfhi->arr[lVar22] == false) {
      local_8c[lVar22] = local_8c[lVar22] + 1;
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 3);
  iVar6 = (vbx->smallend).vect[0];
  iVar7 = (vbx->smallend).vect[1];
  if (((((iVar6 <= (int)local_98) || (iVar7 <= local_98._4_4_)) ||
       ((vbx->smallend).vect[2] <= local_90)) ||
      ((local_8c[0] <= (vbx->bigend).vect[0] || (local_8c[1] <= (vbx->bigend).vect[1])))) ||
     ((int)uStack_84 <= (vbx->bigend).vect[2])) {
    iVar24 = (vbx->smallend).vect[2] + -1;
    iVar16 = (vbx->bigend).vect[2] + 1;
    if (iVar24 <= iVar16) {
      iVar6 = iVar6 + -1;
      iVar7 = iVar7 + -1;
      iVar8 = (vbx->bigend).vect[0];
      bVar50 = (domain->btype).itype != 0;
      iVar25 = (vbx->bigend).vect[1] + 1;
      iVar9 = (domain->bigend).vect[0];
      iVar10 = (domain->smallend).vect[0];
      lVar43 = (long)iVar10 + -1;
      lVar49 = (long)(domain->smallend).vect[1] + -1;
      lVar45 = (long)(domain->smallend).vect[2] + -1;
      lVar42 = (long)(domain->bigend).vect[1] + 1;
      lVar22 = (long)(domain->bigend).vect[2] + 1;
      uVar26 = ~(uint)bVar50;
      iVar17 = -(uint)bVar50;
      iVar18 = bVar50 + 1;
      iVar14 = (int)lVar43;
      iVar19 = (uint)bVar50 + iVar14 + 1;
      do {
        if (iVar7 <= iVar25) {
          iVar20 = uVar26 + iVar24;
          iVar21 = iVar18 + iVar24;
          iVar41 = iVar7;
          do {
            if (iVar6 <= iVar8 + 1) {
              local_130 = (int)lVar22;
              bVar52 = iVar24 == local_130;
              iVar44 = (int)lVar45;
              bVar53 = iVar24 == iVar44;
              bVar51 = bflo->arr[0];
              bVar1 = bflo->arr[1];
              bVar2 = bflo->arr[2];
              bVar3 = bfhi->arr[1];
              bVar4 = bfhi->arr[2];
              iVar48 = (int)lVar49;
              bVar54 = iVar41 == iVar48;
              local_120 = (int)lVar42;
              bVar55 = iVar41 == local_120;
              piVar11 = a->p;
              lVar12 = a->jstride;
              lVar13 = a->kstride;
              iVar27 = uVar26 + iVar41;
              iVar28 = iVar18 + iVar41;
              bVar5 = bfhi->arr[0];
              iVar29 = iVar6;
              do {
                if (((iVar29 < (int)local_98) || (iVar41 < local_98._4_4_)) ||
                   ((iVar24 < local_90 ||
                    (((local_8c[0] < iVar29 || (local_8c[1] < iVar41)) || ((int)uStack_84 < iVar24))
                    )))) {
                  iVar46 = iVar29 - iVar10;
                  bVar56 = iVar46 != -1;
                  if ((iVar41 != iVar48 || bVar56) || (iVar24 != iVar44)) {
LAB_0068b076:
                    iVar31 = iVar29 - iVar9;
                    bVar57 = iVar31 == 1;
                    if ((iVar41 == iVar48 && bVar57) && (iVar24 == iVar44)) {
                      if ((bVar5 & 1U) != 0) {
                        iVar30 = iVar29 - (a->begin).x;
                        lVar47 = (long)(iVar30 + iVar17 + -1);
                        iVar46 = (a->begin).y;
                        iVar31 = (a->begin).z;
                        lVar33 = (long)iVar30;
                        if ((bVar1 & 1U) == 0) {
                          piVar35 = piVar11 + (iVar48 - iVar46) * lVar12;
                          piVar23 = piVar35 + lVar47;
                          if ((bVar2 & 1U) == 0) goto LAB_0068b784;
                          iVar46 = piVar23[(iVar21 - iVar31) * lVar13];
                          goto LAB_0068b3f9;
                        }
                        piVar23 = piVar11 + (iVar28 - iVar46) * lVar12 + lVar47;
                        lVar47 = (iVar48 - iVar46) * lVar12;
                        if ((bVar2 & 1U) == 0) goto LAB_0068b76c;
                        iVar46 = piVar23[(iVar21 - iVar31) * lVar13];
                        lVar39 = (iVar44 - iVar31) * lVar13;
                        goto LAB_0068b779;
                      }
                      if (((bVar1 | bVar2) & 1U) != 0) goto LAB_0068b148;
                    }
                    if ((bVar56 || iVar41 != local_120) || (iVar24 != iVar44)) {
LAB_0068b335:
                      if ((bVar57 && iVar41 == local_120) && (iVar24 == iVar44)) {
                        if ((bVar5 & 1U) == 0) {
                          if (((bVar3 | bVar2) & 1U) != 0) goto LAB_0068b420;
                          goto LAB_0068b496;
                        }
                        iVar30 = iVar29 - (a->begin).x;
                        lVar33 = (long)(iVar17 + iVar30 + -1);
                        iVar31 = (a->begin).y;
                        iVar46 = (a->begin).z;
                        lVar34 = (long)iVar30;
                        if ((bVar3 & 1U) != 0) {
                          lVar33 = (iVar27 - iVar31) * lVar12 + lVar33;
                          goto LAB_0068b46a;
                        }
                        piVar35 = piVar11 + (local_120 - iVar31) * lVar12;
                        piVar23 = piVar35 + lVar33;
                        iVar31 = iVar44;
                        if ((bVar2 & 1U) != 0) {
                          iVar30 = piVar23[(iVar21 - iVar46) * lVar13];
LAB_0068bb9a:
                          iVar31 = iVar31 - iVar46;
                          goto LAB_0068bb9c;
                        }
LAB_0068bc83:
                        iVar31 = iVar31 - iVar46;
LAB_0068bc85:
                        lVar47 = iVar31 * lVar13;
                        iVar46 = piVar23[lVar47];
LAB_0068bc91:
                        piVar35 = piVar35 + lVar34;
LAB_0068bc95:
                        piVar35[lVar47] = iVar46;
                        goto LAB_0068c075;
                      }
LAB_0068b496:
                      if ((iVar41 != iVar48 || bVar56) || iVar24 != local_130) {
LAB_0068b4ab:
                        if ((iVar41 == iVar48 && bVar57) && iVar24 == local_130) {
                          if ((bVar5 & 1U) != 0) {
                            iVar30 = iVar29 - (a->begin).x;
                            lVar33 = (long)(iVar17 + iVar30 + -1);
                            iVar31 = (a->begin).y;
                            iVar46 = (a->begin).z;
                            lVar34 = (long)iVar30;
                            if ((bVar1 & 1U) == 0) {
                              piVar35 = piVar11 + (iVar48 - iVar31) * lVar12;
                              piVar23 = piVar35 + lVar33;
                              iVar31 = local_130;
                              if ((bVar4 & 1U) == 0) goto LAB_0068bc83;
                              iVar30 = piVar23[(iVar20 - iVar46) * lVar13];
                              goto LAB_0068bb9a;
                            }
                            lVar33 = (iVar28 - iVar31) * lVar12 + lVar33;
                            goto LAB_0068b8b4;
                          }
                          if (((bVar1 | bVar4) & 1U) != 0) goto LAB_0068b86c;
                        }
                        if ((!bVar56 && iVar41 == local_120) && iVar24 == local_130) {
                          if ((bVar51 & 1U) == 0) {
                            if (((bVar3 | bVar4) & 1U) == 0) goto LAB_0068b4d5;
                            cVar36 = bfhi->arr[2];
                            if ((bVar3 & 1U) != 0) {
LAB_0068ba79:
                              lVar34 = (long)(iVar29 - (a->begin).x);
                              iVar46 = (a->begin).y;
                              lVar47 = a->kstride;
                              lVar39 = (long)(iVar27 - iVar46) * a->jstride;
                              iVar31 = (a->begin).z;
                              lVar33 = (long)(local_120 - iVar46) * a->jstride;
                              if (cVar36 != '\0') {
                                iVar30 = piVar11[lVar39 + lVar34 + (iVar20 - iVar31) * lVar47];
                                lVar47 = (local_130 - iVar31) * lVar47;
                                goto LAB_0068b276;
                              }
                              lVar47 = lVar47 * (local_130 - iVar31);
                              iVar30 = piVar11[lVar39 + lVar34 + lVar47];
                              piVar35 = piVar11 + lVar33;
                              goto LAB_0068bba3;
                            }
LAB_0068bbe5:
                            if (cVar36 == '\0') goto LAB_0068c075;
                            iVar31 = (a->begin).x;
                            iVar46 = (a->begin).y;
                            iVar30 = local_120;
LAB_0068bc03:
                            lVar33 = ((long)iVar30 - (long)iVar46) * a->jstride;
LAB_0068bc0b:
                            iVar32 = (a->begin).z;
                            lVar47 = a->kstride;
                            piVar23 = piVar11 + lVar33 + (iVar29 - iVar31);
                            iVar46 = piVar23[(iVar20 - iVar32) * lVar47];
                            iVar31 = local_130;
LAB_0068bc37:
                            lVar47 = (iVar31 - iVar32) * lVar47;
                            goto LAB_0068ba4a;
                          }
                          cVar36 = bfhi->arr[2];
                          iVar46 = iVar29 - (a->begin).x;
                          iVar31 = iVar18 + iVar46;
LAB_0068b965:
                          lVar34 = (long)iVar31;
                          iVar31 = (a->begin).y;
                          lVar33 = a->jstride;
                          lVar47 = a->kstride;
                          iVar32 = (a->begin).z;
                          lVar39 = (long)iVar46;
                          if (bfhi->arr[1] == true) {
                            lVar38 = (iVar27 - iVar31) * lVar33;
                            lVar33 = (local_120 - iVar31) * lVar33;
                            if (cVar36 == '\0') {
                              lVar47 = lVar47 * (local_130 - iVar32);
                              iVar31 = piVar11[lVar38 + lVar34 + lVar47];
                              piVar23 = piVar11 + lVar33 + lVar39;
                              goto LAB_0068c072;
                            }
                            iVar30 = piVar11[lVar38 + lVar34 + (iVar20 - iVar32) * lVar47];
                            lVar47 = (local_130 - iVar32) * lVar47;
                            piVar35 = piVar11 + lVar33 + lVar39;
                          }
                          else {
                            lVar33 = lVar33 * (local_120 - iVar31);
                            if (cVar36 == '\0') {
                              lVar47 = lVar47 * (local_130 - iVar32);
                              iVar31 = piVar11[lVar33 + lVar34 + lVar47];
                              piVar23 = piVar11 + lVar33 + lVar39;
                              goto LAB_0068c072;
                            }
                            iVar30 = piVar11[lVar33 + lVar34 + (iVar20 - iVar32) * lVar47];
                            lVar47 = (local_130 - iVar32) * lVar47;
                            piVar35 = piVar11 + lVar33 + lVar39;
                          }
                          goto LAB_0068bba7;
                        }
LAB_0068b4d5:
                        if ((bVar57 && iVar41 == local_120) && iVar24 == local_130) {
                          if ((bVar5 & 1U) != 0) {
                            cVar36 = bfhi->arr[2];
                            iVar46 = iVar29 - (a->begin).x;
                            iVar31 = iVar17 + iVar46 + -1;
                            goto LAB_0068b965;
                          }
                          if (((bVar3 | bVar4) & 1U) != 0) {
                            cVar36 = bfhi->arr[2];
                            if (bfhi->arr[1] != true) goto LAB_0068bbe5;
                            goto LAB_0068ba79;
                          }
                        }
                        if ((iVar46 == -1) && (iVar41 == iVar48)) {
                          if ((bVar51 & 1U) == 0) {
                            if ((bVar1 & 1U) == 0) goto LAB_0068bcc3;
                            if (bflo->arr[1] != true) goto LAB_0068c075;
                            iVar46 = (a->begin).x;
                            lVar33 = lVar43;
LAB_0068bd69:
                            lVar33 = lVar33 - iVar46;
                            iVar46 = (a->begin).y;
                            lVar47 = a->jstride;
                            lVar39 = ((long)iVar24 - (long)(a->begin).z) * a->kstride;
                            iVar31 = piVar11[(iVar28 - iVar46) * lVar47 + lVar33 + lVar39];
                            iVar30 = iVar48;
LAB_0068bfa8:
                            piVar11[(iVar30 - iVar46) * lVar47 + lVar33 + lVar39] = iVar31;
                            goto LAB_0068c075;
                          }
                          iVar31 = (a->begin).x;
                          iVar46 = (a->begin).y;
                          lVar33 = a->jstride;
                          lVar47 = ((long)iVar24 - (long)(a->begin).z) * a->kstride;
                          lVar39 = (long)(iVar14 - iVar31);
                          iVar30 = iVar48;
                          if (bflo->arr[1] == true) {
                            iVar31 = piVar11[(iVar28 - iVar46) * lVar33 + (iVar19 - iVar31) + lVar47
                                            ];
LAB_0068be33:
                            piVar23 = piVar11 + (iVar30 - iVar46) * lVar33;
                          }
                          else {
LAB_0068c054:
                            piVar23 = piVar11 + lVar33 * (iVar30 - iVar46);
LAB_0068c067:
                            iVar31 = piVar23[(iVar19 - iVar31) + lVar47];
                          }
LAB_0068c06e:
                          piVar23 = piVar23 + lVar39;
LAB_0068c072:
                          piVar23[lVar47] = iVar31;
                          goto LAB_0068c075;
                        }
LAB_0068bcc3:
                        iVar30 = (int)((long)iVar9 + 1);
                        if ((iVar31 == 1) && (iVar41 == iVar48)) {
                          if ((bVar5 & 1U) == 0) {
                            if ((bVar1 & 1U) != 0) {
                              if (bflo->arr[1] != true) goto LAB_0068c075;
                              iVar46 = (a->begin).x;
                              lVar33 = (long)iVar9 + 1;
                              goto LAB_0068bd69;
                            }
                            goto LAB_0068bdaa;
                          }
                          iVar46 = (a->begin).x;
                          lVar39 = (long)(int)(iVar9 - ((uint)bVar50 + iVar46));
                          iVar32 = (a->begin).y;
                          lVar33 = a->jstride;
                          lVar47 = ((long)iVar24 - (long)(a->begin).z) * a->kstride;
                          lVar34 = (long)(iVar30 - iVar46);
                          iVar46 = iVar48;
                          if (bflo->arr[1] == true) {
                            iVar31 = piVar11[(iVar28 - iVar32) * lVar33 + lVar39 + lVar47];
LAB_0068bf24:
                            piVar23 = piVar11 + (iVar46 - iVar32) * lVar33 + lVar34;
                            goto LAB_0068c072;
                          }
LAB_0068c142:
                          lVar33 = lVar33 * (iVar46 - iVar32);
                          iVar46 = piVar11[lVar33 + lVar39 + lVar47];
                          piVar23 = piVar11 + lVar33 + lVar34;
                          goto LAB_0068ba4a;
                        }
LAB_0068bdaa:
                        if ((iVar46 == -1) && (iVar41 == local_120)) {
                          if ((bVar51 & 1U) != 0) {
                            iVar31 = (a->begin).x;
                            iVar46 = (a->begin).y;
                            lVar33 = a->jstride;
                            lVar47 = ((long)iVar24 - (long)(a->begin).z) * a->kstride;
                            lVar39 = (long)(iVar14 - iVar31);
                            iVar30 = local_120;
                            if (bfhi->arr[1] != true) goto LAB_0068c054;
                            iVar31 = piVar11[(iVar27 - iVar46) * lVar33 + (iVar19 - iVar31) + lVar47
                                            ];
                            goto LAB_0068be33;
                          }
                          if ((bVar3 & 1U) == 0) goto LAB_0068be99;
                          if (bfhi->arr[1] != true) goto LAB_0068c075;
                          iVar46 = (a->begin).x;
                          iVar30 = iVar14;
LAB_0068bf67:
                          lVar33 = (long)iVar30 - (long)iVar46;
                          iVar46 = (a->begin).y;
                          lVar47 = a->jstride;
                          lVar39 = ((long)iVar24 - (long)(a->begin).z) * a->kstride;
                          iVar31 = piVar11[(iVar27 - iVar46) * lVar47 + lVar33 + lVar39];
                          iVar30 = local_120;
                          goto LAB_0068bfa8;
                        }
LAB_0068be99:
                        if ((iVar31 == 1) && (iVar41 == local_120)) {
                          if ((bVar5 & 1U) != 0) {
                            iVar46 = (a->begin).x;
                            lVar39 = (long)(int)(iVar9 - ((uint)bVar50 + iVar46));
                            iVar32 = (a->begin).y;
                            lVar33 = a->jstride;
                            lVar47 = ((long)iVar24 - (long)(a->begin).z) * a->kstride;
                            lVar34 = (long)(iVar30 - iVar46);
                            iVar46 = local_120;
                            if (bfhi->arr[1] == true) {
                              iVar31 = piVar11[(iVar27 - iVar32) * lVar33 + lVar39 + lVar47];
                              goto LAB_0068bf24;
                            }
                            goto LAB_0068c142;
                          }
                          if ((bVar3 & 1U) != 0) {
                            if (bfhi->arr[1] != true) goto LAB_0068c075;
                            iVar46 = (a->begin).x;
                            goto LAB_0068bf67;
                          }
                        }
                        iVar32 = iVar44;
                        if ((iVar46 != -1) || (iVar24 != iVar44)) {
LAB_0068c0b3:
                          if ((iVar31 == 1) && (iVar24 == iVar44)) {
                            if ((bVar5 & 1U) == 0) {
                              if ((bVar2 & 1U) != 0) {
                                if (bflo->arr[2] != true) goto LAB_0068c075;
                                iVar46 = (a->begin).x;
                                goto LAB_0068c184;
                              }
                              goto LAB_0068c1c5;
                            }
                            iVar46 = (a->begin).x;
                            iVar37 = (a->begin).z;
                            lVar47 = a->kstride;
                            piVar23 = piVar11 + ((long)iVar41 - (long)(a->begin).y) * a->jstride;
                            piVar35 = piVar23 + (int)(iVar9 - ((uint)bVar50 + iVar46));
                            lVar39 = (long)(iVar30 - iVar46);
                            iVar46 = iVar44;
                            if (bflo->arr[2] == true) {
                              iVar46 = piVar35[(iVar21 - iVar37) * lVar47];
                              goto LAB_0068c314;
                            }
LAB_0068c4be:
                            lVar47 = lVar47 * (iVar46 - iVar37);
                            iVar31 = piVar35[lVar47];
                            goto LAB_0068c06e;
                          }
LAB_0068c1c5:
                          iVar32 = local_130;
                          if ((iVar46 == -1) && (iVar24 == local_130)) {
                            if ((bVar51 & 1U) != 0) {
                              iVar31 = (a->begin).x;
                              iVar37 = (a->begin).z;
                              lVar47 = a->kstride;
                              piVar23 = piVar11 + ((long)iVar41 - (long)(a->begin).y) * a->jstride;
                              lVar39 = (long)(iVar14 - iVar31);
                              iVar46 = local_130;
                              if (bfhi->arr[2] != true) goto LAB_0068c3fd;
                              iVar46 = piVar23[(long)(iVar19 - iVar31) + (iVar20 - iVar37) * lVar47]
                              ;
                              goto LAB_0068c314;
                            }
                            if ((bVar4 & 1U) == 0) goto LAB_0068c286;
                            if (bfhi->arr[2] != true) goto LAB_0068c075;
                            iVar46 = (a->begin).x;
                            iVar30 = iVar14;
LAB_0068c353:
                            iVar31 = (a->begin).z;
                            lVar47 = a->kstride;
                            piVar35 = piVar11 + ((long)iVar41 - (long)(a->begin).y) * a->jstride +
                                                ((long)iVar30 - (long)iVar46);
                            iVar46 = piVar35[(iVar20 - iVar31) * lVar47];
                            iVar30 = local_130;
                            goto LAB_0068c391;
                          }
LAB_0068c286:
                          if ((iVar31 == 1) && (iVar24 == local_130)) {
                            if ((bVar5 & 1U) != 0) {
                              iVar46 = (a->begin).x;
                              iVar37 = (a->begin).z;
                              lVar47 = a->kstride;
                              piVar23 = piVar11 + ((long)iVar41 - (long)(a->begin).y) * a->jstride;
                              piVar35 = piVar23 + (int)(iVar9 - ((uint)bVar50 + iVar46));
                              lVar39 = (long)(iVar30 - iVar46);
                              iVar46 = local_130;
                              if (bfhi->arr[2] == true) {
                                iVar46 = piVar35[(iVar20 - iVar37) * lVar47];
                                goto LAB_0068c314;
                              }
                              goto LAB_0068c4be;
                            }
                            if ((bVar4 & 1U) != 0) {
                              if (bfhi->arr[2] != true) goto LAB_0068c075;
                              iVar46 = (a->begin).x;
                              goto LAB_0068c353;
                            }
                          }
                          if (bVar54 && bVar53) {
                            if ((bVar1 & 1U) == 0) {
                              if ((bVar2 & 1U) == 0) goto LAB_0068c437;
                              if (bflo->arr[2] != true) goto LAB_0068c075;
                              iVar46 = (a->begin).x;
                              iVar31 = (a->begin).y;
                              iVar30 = iVar48;
LAB_0068c4f7:
                              iVar32 = (a->begin).z;
                              lVar47 = a->kstride;
                              piVar23 = piVar11 + ((long)iVar30 - (long)iVar31) * a->jstride +
                                                  (long)(iVar29 - iVar46);
                              iVar46 = piVar23[(iVar21 - iVar32) * lVar47];
                              iVar31 = iVar44;
                              goto LAB_0068bc37;
                            }
                            lVar34 = (long)(iVar29 - (a->begin).x);
                            iVar46 = (a->begin).y;
                            lVar33 = a->jstride;
                            LVar40 = a->kstride;
                            iVar31 = (a->begin).z;
                            lVar47 = (iVar28 - iVar46) * lVar33 + lVar34;
                            iVar30 = iVar48;
LAB_0068c487:
                            piVar23 = piVar11 + lVar47;
                            lVar33 = (iVar30 - iVar46) * lVar33;
                            iVar46 = iVar44;
                            if (bflo->arr[2] != true) {
LAB_0068c632:
                              lVar47 = LVar40 * (iVar46 - iVar31);
                              iVar30 = piVar23[lVar47];
                              goto LAB_0068b8e9;
                            }
                            iVar46 = piVar23[(iVar21 - iVar31) * LVar40];
                            iVar30 = iVar44;
                          }
                          else {
LAB_0068c437:
                            if (bVar55 && bVar53) {
                              if ((bVar3 & 1U) != 0) {
                                lVar34 = (long)(iVar29 - (a->begin).x);
                                iVar46 = (a->begin).y;
                                lVar33 = a->jstride;
                                LVar40 = a->kstride;
                                iVar31 = (a->begin).z;
                                lVar47 = (iVar27 - iVar46) * lVar33 + lVar34;
                                iVar30 = local_120;
                                goto LAB_0068c487;
                              }
                              if ((bVar2 & 1U) != 0) {
                                if (bflo->arr[2] != true) goto LAB_0068c075;
                                iVar46 = (a->begin).x;
                                iVar31 = (a->begin).y;
                                iVar30 = local_120;
                                goto LAB_0068c4f7;
                              }
                            }
                            if (!bVar54 || !bVar52) {
LAB_0068c5a4:
                              if (bVar55 && bVar52) {
                                if ((bVar3 & 1U) != 0) {
                                  lVar34 = (long)(iVar29 - (a->begin).x);
                                  iVar46 = (a->begin).y;
                                  lVar33 = a->jstride;
                                  LVar40 = a->kstride;
                                  iVar31 = (a->begin).z;
                                  lVar47 = (iVar27 - iVar46) * lVar33 + lVar34;
                                  iVar30 = local_120;
                                  goto LAB_0068c5f4;
                                }
                                if ((bVar4 & 1U) != 0) {
                                  iVar31 = (a->begin).x;
                                  lVar33 = ((long)local_120 - (long)(a->begin).y) * lVar12;
                                  goto LAB_0068bc0b;
                                }
                              }
                              if ((iVar46 == -1 & bVar51) == 1) {
                                iVar30 = (a->begin).x;
                                lVar33 = ((long)iVar24 - (long)(a->begin).z) * lVar13;
                                piVar23 = piVar11 + ((long)iVar41 - (long)(a->begin).y) * lVar12;
                                iVar46 = piVar23[(iVar19 - iVar30) + lVar33];
                                iVar30 = iVar14 - iVar30;
                              }
                              else {
                                if ((iVar31 == 1 & bVar5) != 1) {
                                  if ((bVar54 & bVar1) == 0) {
                                    if ((bVar55 & bVar3) == 0) {
                                      if ((bVar53 & bVar2) != 0) {
                                        iVar31 = (a->begin).x;
                                        iVar46 = (a->begin).y;
                                        iVar30 = iVar41;
                                        goto LAB_0068b72d;
                                      }
                                      if ((bVar52 & bVar4) == 0) goto LAB_0068c075;
                                      iVar46 = (a->begin).x;
                                      iVar31 = (a->begin).y;
                                      iVar30 = iVar41;
                                      goto LAB_0068ba09;
                                    }
                                    lVar33 = (long)(iVar29 - (a->begin).x);
                                    iVar46 = (a->begin).y;
                                    lVar47 = ((long)iVar24 - (long)(a->begin).z) * lVar13;
                                    iVar31 = piVar11[(iVar27 - iVar46) * lVar12 + lVar33 + lVar47];
                                    iVar30 = local_120;
                                  }
                                  else {
                                    lVar33 = (long)(iVar29 - (a->begin).x);
                                    iVar46 = (a->begin).y;
                                    lVar47 = ((long)iVar24 - (long)(a->begin).z) * lVar13;
                                    iVar31 = piVar11[(iVar28 - iVar46) * lVar12 + lVar33 + lVar47];
                                    iVar30 = iVar48;
                                  }
                                  piVar11[(iVar30 - iVar46) * lVar12 + lVar33 + lVar47] = iVar31;
                                  goto LAB_0068c075;
                                }
                                iVar31 = (a->begin).x;
                                lVar33 = ((long)iVar24 - (long)(a->begin).z) * lVar13;
                                piVar23 = piVar11 + ((long)iVar41 - (long)(a->begin).y) * lVar12;
                                iVar46 = piVar23[(int)(iVar9 - ((uint)bVar50 + iVar31)) + lVar33];
                                iVar30 = iVar30 - iVar31;
                              }
                              piVar23[iVar30 + lVar33] = iVar46;
                              goto LAB_0068c075;
                            }
                            if ((bVar1 & 1U) == 0) {
                              if ((bVar4 & 1U) != 0) {
                                if (bfhi->arr[2] != true) goto LAB_0068c075;
                                iVar31 = (a->begin).x;
                                iVar46 = (a->begin).y;
                                iVar30 = iVar48;
                                goto LAB_0068bc03;
                              }
                              goto LAB_0068c5a4;
                            }
                            lVar34 = (long)(iVar29 - (a->begin).x);
                            iVar46 = (a->begin).y;
                            lVar33 = a->jstride;
                            LVar40 = a->kstride;
                            iVar31 = (a->begin).z;
                            lVar47 = (iVar28 - iVar46) * lVar33 + lVar34;
                            iVar30 = iVar48;
LAB_0068c5f4:
                            piVar23 = piVar11 + lVar47;
                            lVar33 = (iVar30 - iVar46) * lVar33;
                            iVar46 = local_130;
                            if (bfhi->arr[2] != true) goto LAB_0068c632;
                            iVar46 = piVar23[(iVar20 - iVar31) * LVar40];
                            iVar30 = local_130;
                          }
                          lVar47 = (iVar30 - iVar31) * LVar40;
                          goto LAB_0068b5fe;
                        }
                        if ((bVar51 & 1U) == 0) {
                          if ((bVar2 & 1U) == 0) goto LAB_0068c0b3;
                          if (bflo->arr[2] != true) goto LAB_0068c075;
                          iVar46 = (a->begin).x;
                          iVar30 = iVar14;
LAB_0068c184:
                          iVar31 = (a->begin).z;
                          lVar47 = a->kstride;
                          piVar35 = piVar11 + ((long)iVar41 - (long)(a->begin).y) * a->jstride +
                                              ((long)iVar30 - (long)iVar46);
                          iVar46 = piVar35[(iVar21 - iVar31) * lVar47];
                          iVar30 = iVar44;
LAB_0068c391:
                          lVar47 = (iVar30 - iVar31) * lVar47;
                          goto LAB_0068bc95;
                        }
                        iVar31 = (a->begin).x;
                        iVar37 = (a->begin).z;
                        lVar47 = a->kstride;
                        piVar23 = piVar11 + ((long)iVar41 - (long)(a->begin).y) * a->jstride;
                        lVar39 = (long)(iVar14 - iVar31);
                        iVar46 = iVar44;
                        if (bflo->arr[2] != true) {
LAB_0068c3fd:
                          lVar47 = lVar47 * (iVar46 - iVar37);
                          goto LAB_0068c067;
                        }
                        iVar46 = piVar23[(long)(iVar19 - iVar31) + (iVar21 - iVar37) * lVar47];
LAB_0068c314:
                        lVar47 = (iVar32 - iVar37) * lVar47;
                        piVar23 = piVar23 + lVar39;
                      }
                      else {
                        if ((bVar51 & 1U) == 0) {
                          if (((bVar1 | bVar4) & 1U) == 0) goto LAB_0068b4ab;
LAB_0068b86c:
                          if ((bVar1 & 1U) != 0) {
                            lVar34 = (long)(iVar29 - (a->begin).x);
                            iVar31 = (a->begin).y;
                            iVar46 = (a->begin).z;
                            lVar33 = (iVar28 - iVar31) * lVar12 + lVar34;
LAB_0068b8b4:
                            piVar23 = piVar11 + lVar33;
                            lVar33 = (iVar48 - iVar31) * lVar12;
                            iVar31 = local_130;
                            if ((bVar4 & 1U) == 0) goto LAB_0068baf2;
                            iVar30 = piVar23[(iVar20 - iVar46) * lVar13];
                            goto LAB_0068b8e0;
                          }
                          if ((bVar4 & 1U) == 0) goto LAB_0068c075;
                          iVar46 = (a->begin).x;
                          iVar31 = (a->begin).y;
                          iVar30 = iVar48;
LAB_0068ba09:
                          iVar32 = (a->begin).z;
                          piVar23 = piVar11 + ((long)iVar30 - (long)iVar31) * lVar12 +
                                              (long)(iVar29 - iVar46);
                          iVar46 = piVar23[(iVar20 - iVar32) * lVar13];
                          iVar31 = local_130;
                          goto LAB_0068ba40;
                        }
                        iVar30 = iVar29 - (a->begin).x;
                        lVar33 = (long)(iVar18 + iVar30);
                        iVar46 = (a->begin).y;
                        iVar31 = (a->begin).z;
                        lVar34 = (long)iVar30;
                        if ((bVar1 & 1U) == 0) {
                          piVar35 = piVar11 + (iVar48 - iVar46) * lVar12;
                          piVar23 = piVar35 + lVar33;
                          if ((bVar4 & 1U) == 0) {
                            iVar31 = local_130 - iVar31;
                            goto LAB_0068bc85;
                          }
                          iVar30 = piVar23[(iVar20 - iVar31) * lVar13];
                          iVar31 = local_130 - iVar31;
LAB_0068bb9c:
                          lVar47 = iVar31 * lVar13;
                          goto LAB_0068bba3;
                        }
                        piVar23 = piVar11 + (iVar28 - iVar46) * lVar12 + lVar33;
                        lVar33 = (iVar48 - iVar46) * lVar12;
                        if ((bVar4 & 1U) == 0) {
                          iVar31 = local_130 - iVar31;
                          goto LAB_0068baf4;
                        }
                        iVar46 = piVar23[(iVar20 - iVar31) * lVar13];
                        lVar47 = (lVar22 - iVar31) * lVar13;
LAB_0068b5fe:
                        piVar23 = piVar11 + lVar33 + lVar34;
                      }
                      piVar23[lVar47] = iVar46;
                    }
                    else {
                      if ((bVar51 & 1U) != 0) {
                        if ((bVar3 & 1U) == 0) {
                          iVar31 = iVar29 - (a->begin).x;
                          lVar33 = ((long)local_120 - (long)(a->begin).y) * lVar12;
                          iVar46 = (a->begin).z;
                          if ((bVar2 & 1U) == 0) {
                            lVar47 = (iVar44 - iVar46) * lVar13;
                            iVar46 = piVar11[lVar33 + (iVar18 + iVar31) + lVar47];
                            lVar33 = lVar33 + iVar31;
                            goto LAB_0068b858;
                          }
                          iVar30 = piVar11[lVar33 + (long)(iVar18 + iVar31) +
                                                    (iVar21 - iVar46) * lVar13];
                          lVar47 = (iVar44 - iVar46) * lVar13;
                          lVar33 = lVar33 + iVar31;
                        }
                        else {
                          iVar30 = iVar29 - (a->begin).x;
                          lVar39 = (long)(iVar18 + iVar30);
                          iVar46 = (a->begin).y;
                          lVar38 = (iVar27 - iVar46) * lVar12;
                          iVar31 = (a->begin).z;
                          lVar34 = (long)iVar30;
                          lVar33 = (lVar42 - iVar46) * lVar12;
                          if ((bVar2 & 1U) == 0) {
                            lVar47 = (iVar44 - iVar31) * lVar13;
                            iVar46 = piVar11[lVar38 + lVar39 + lVar47];
                            lVar33 = lVar33 + lVar34;
LAB_0068b858:
                            (piVar11 + lVar33)[lVar47] = iVar46;
                            goto LAB_0068c075;
                          }
                          iVar30 = piVar11[lVar38 + lVar39 + (iVar21 - iVar31) * lVar13];
                          lVar47 = (iVar44 - iVar31) * lVar13;
LAB_0068b276:
                          lVar33 = lVar33 + lVar34;
                        }
                        (piVar11 + lVar33)[lVar47] = iVar30;
                        goto LAB_0068c075;
                      }
                      if (((bVar3 | bVar2) & 1U) == 0) goto LAB_0068b335;
LAB_0068b420:
                      if ((bVar3 & 1U) == 0) {
                        if ((bVar2 & 1U) == 0) goto LAB_0068c075;
                        iVar31 = (a->begin).x;
                        iVar46 = (a->begin).y;
                        iVar30 = local_120;
LAB_0068b72d:
                        iVar32 = (a->begin).z;
                        piVar23 = piVar11 + ((long)iVar30 - (long)iVar46) * lVar12 +
                                            (long)(iVar29 - iVar31);
                        iVar46 = piVar23[(iVar21 - iVar32) * lVar13];
                        iVar31 = iVar44;
LAB_0068ba40:
                        lVar47 = (iVar31 - iVar32) * lVar13;
LAB_0068ba4a:
                        piVar23[lVar47] = iVar46;
                      }
                      else {
                        lVar34 = (long)(iVar29 - (a->begin).x);
                        iVar31 = (a->begin).y;
                        iVar46 = (a->begin).z;
                        lVar33 = (iVar27 - iVar31) * lVar12 + lVar34;
LAB_0068b46a:
                        piVar23 = piVar11 + lVar33;
                        lVar33 = (local_120 - iVar31) * lVar12;
                        iVar31 = iVar44;
                        if ((bVar2 & 1U) == 0) {
LAB_0068baf2:
                          iVar31 = iVar31 - iVar46;
LAB_0068baf4:
                          lVar47 = iVar31 * lVar13;
                          iVar46 = piVar23[lVar47];
                          piVar35 = piVar11 + lVar33;
                          goto LAB_0068bc91;
                        }
                        iVar30 = piVar23[(iVar21 - iVar46) * lVar13];
LAB_0068b8e0:
                        lVar47 = (iVar31 - iVar46) * lVar13;
LAB_0068b8e9:
                        piVar35 = piVar11 + lVar33;
LAB_0068bba3:
                        piVar35 = piVar35 + lVar34;
LAB_0068bba7:
                        piVar35[lVar47] = iVar30;
                      }
                    }
                  }
                  else if ((bVar51 & 1U) == 0) {
                    if (((bVar1 | bVar2) & 1U) == 0) goto LAB_0068b076;
LAB_0068b148:
                    if ((bVar1 & 1U) == 0) {
                      if ((bVar2 & 1U) != 0) {
                        lVar33 = (long)(iVar29 - (a->begin).x);
                        lVar47 = ((long)iVar48 - (long)(a->begin).y) * lVar12;
                        iVar46 = (a->begin).z;
                        piVar11[lVar47 + lVar33 + (iVar44 - iVar46) * lVar13] =
                             piVar11[lVar47 + lVar33 + (iVar21 - iVar46) * lVar13];
                      }
                    }
                    else {
                      lVar33 = (long)(iVar29 - (a->begin).x);
                      iVar46 = (a->begin).y;
                      iVar31 = (a->begin).z;
                      lVar47 = (iVar28 - iVar46) * lVar12;
                      if ((bVar2 & 1U) == 0) {
                        lVar39 = (iVar44 - iVar31) * lVar13;
                        iVar30 = piVar11[lVar47 + lVar33 + lVar39];
                      }
                      else {
                        iVar30 = piVar11[lVar47 + lVar33 + (iVar21 - iVar31) * lVar13];
                        lVar39 = (iVar44 - iVar31) * lVar13;
                      }
                      piVar11[(iVar48 - iVar46) * lVar12 + lVar33 + lVar39] = iVar30;
                    }
                  }
                  else {
                    iVar30 = iVar29 - (a->begin).x;
                    lVar47 = (long)(iVar30 + iVar18);
                    iVar46 = (a->begin).y;
                    iVar31 = (a->begin).z;
                    lVar33 = (long)iVar30;
                    if ((bVar1 & 1U) == 0) {
                      piVar35 = piVar11 + (iVar48 - iVar46) * lVar12;
                      piVar23 = piVar35 + lVar47;
                      if ((bVar2 & 1U) == 0) {
LAB_0068b784:
                        lVar39 = (iVar44 - iVar31) * lVar13;
                        iVar46 = piVar23[lVar39];
                      }
                      else {
                        iVar46 = piVar23[(iVar21 - iVar31) * lVar13];
LAB_0068b3f9:
                        lVar39 = (iVar44 - iVar31) * lVar13;
                      }
                    }
                    else {
                      piVar23 = piVar11 + (iVar28 - iVar46) * lVar12 + lVar47;
                      lVar47 = (lVar49 - iVar46) * lVar12;
                      if ((bVar2 & 1U) != 0) {
                        piVar11[lVar47 + lVar33 + (lVar45 - iVar31) * lVar13] =
                             piVar23[(iVar21 - iVar31) * lVar13];
                        goto LAB_0068c075;
                      }
LAB_0068b76c:
                      lVar39 = (iVar44 - iVar31) * lVar13;
                      iVar46 = piVar23[lVar39];
LAB_0068b779:
                      piVar35 = piVar11 + lVar47;
                    }
                    piVar35[lVar33 + lVar39] = iVar46;
                  }
                }
LAB_0068c075:
                iVar46 = iVar29 - iVar8;
                iVar29 = iVar29 + 1;
              } while (iVar46 != 1);
            }
            bVar51 = iVar41 != iVar25;
            iVar41 = iVar41 + 1;
          } while (bVar51);
        }
        bVar51 = iVar24 != iVar16;
        iVar24 = iVar24 + 1;
      } while (bVar51);
    }
  }
  return;
}

Assistant:

inline void mlndlap_bc_doit (Box const& vbx, Array4<T> const& a, Box const& domain,
                             GpuArray<bool,AMREX_SPACEDIM> const& bflo,
                             GpuArray<bool,AMREX_SPACEDIM> const& bfhi) noexcept
{
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (! bflo[idim]) gdomain.growLo(idim,1);
        if (! bfhi[idim]) gdomain.growHi(idim,1);
    }

    if (gdomain.strictly_contains(vbx)) return;

    const int offset = domain.cellCentered() ? 0 : 1;

    const auto dlo = amrex::lbound(domain);
    const auto dhi = amrex::ubound(domain);

    Box const& sbox = amrex::grow(vbx,1);
    AMREX_HOST_DEVICE_FOR_3D(sbox, i, j, k,
    {
        if (! gdomain.contains(IntVect(i,j,k))) {
            // xlo & ylo & zlo
            if (i == dlo.x-1 && j == dlo.y-1 && k == dlo.z-1 && (bflo[0] || bflo[1] || bflo[2]))
            {
                if (bflo[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k+1+offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & ylo & zlo
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dlo.z-1 && (bfhi[0] || bflo[1] || bflo[2]))
            {
                if (bfhi[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k+1+offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & yhi & zlo
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dlo.z-1 && (bflo[0] || bfhi[1] || bflo[2]))
            {
                if (bflo[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k+1+offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & yhi & zlo
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dlo.z-1 && (bfhi[0] || bfhi[1] || bflo[2]))
            {
                if (bfhi[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k+1+offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & ylo & zhi
            else if (i == dlo.x-1 && j == dlo.y-1 && k == dhi.z+1 && (bflo[0] || bflo[1] || bfhi[2]))
            {
                if (bflo[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k-1-offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & ylo & zhi
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dhi.z+1 && (bfhi[0] || bflo[1] || bfhi[2]))
            {
                if (bfhi[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k-1-offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & yhi & zhi
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dhi.z+1 && (bflo[0] || bfhi[1] || bfhi[2]))
            {
                if (bflo[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k-1-offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & yhi & zhi
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dhi.z+1 && (bfhi[0] || bfhi[1] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k-1-offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & ylo
            else if (i == dlo.x-1 && j == dlo.y-1 && (bflo[0] || bflo[1]))
            {
                if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xhi & ylo
            else if (i == dhi.x+1 && j == dlo.y-1 && (bfhi[0] || bflo[1]))
            {
                if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xlo & yhi
            else if (i == dlo.x-1 && j == dhi.y+1 && (bflo[0] || bfhi[1]))
            {
                if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xhi & yhi
            else if (i == dhi.x+1 && j == dhi.y+1 && (bfhi[0] || bfhi[1]))
            {
                if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xlo & zlo
            else if (i == dlo.x-1 && k == dlo.z-1 && (bflo[0] || bflo[2]))
            {
                if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & zlo
            else if (i == dhi.x+1 && k == dlo.z-1 && (bfhi[0] || bflo[2]))
            {
                if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & zhi
            else if (i == dlo.x-1 && k == dhi.z+1 && (bflo[0] || bfhi[2]))
            {
                if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & zhi
            else if (i == dhi.x+1 && k == dhi.z+1 && (bfhi[0] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // ylo & zlo
            else if (j == dlo.y-1 && k == dlo.z-1 && (bflo[1] || bflo[2]))
            {
                if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // yhi & zlo
            else if (j == dhi.y+1 && k == dlo.z-1 && (bfhi[1] || bflo[2]))
            {
                if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // ylo & zhi
            else if (j == dlo.y-1 && k == dhi.z+1 && (bflo[1] || bfhi[2]))
            {
                if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // yhi & zhi
            else if (j == dhi.y+1 && k == dhi.z+1 && (bfhi[1] || bfhi[2]))
            {
                if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            else if (i == dlo.x-1 && bflo[0])
            {
                a(i,j,k) = a(i+1+offset, j, k);
            }
            else if (i == dhi.x+1 && bfhi[0])
            {
                a(i,j,k) = a(i-1-offset, j, k);
            }
            else if (j == dlo.y-1 && bflo[1])
            {
                a(i,j,k) = a(i, j+1+offset, k);
            }
            else if (j == dhi.y+1 && bfhi[1])
            {
                a(i,j,k) = a(i, j-1-offset, k);
            }
            else if (k == dlo.z-1 && bflo[2])
            {
                a(i,j,k) = a(i, j, k+1+offset);
            }
            else if (k == dhi.z+1 && bfhi[2])
            {
                a(i,j,k) = a(i, j, k-1-offset);
            }
        }
    });
}